

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O2

ColorFilterNode * rengine::ColorFilterNode::create(void)

{
  undefined1 *puVar1;
  ColorFilterNode *this;
  
  if (__allocation_pool_rengine_ColorFilterNode.m_nextFree <
      __allocation_pool_rengine_ColorFilterNode.m_poolSize) {
    this = AllocationPool<rengine::ColorFilterNode>::allocate
                     (&__allocation_pool_rengine_ColorFilterNode);
    puVar1 = &(this->super_Node).field_0x31;
    *puVar1 = *puVar1 | 2;
  }
  else {
    this = (ColorFilterNode *)operator_new(0x78);
    ColorFilterNode(this);
  }
  return this;
}

Assistant:

ColorFilterNode *create(mat4 matrix) {
        auto node = create();
        node->setColorMatrix(matrix);
        return node;
    }